

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,IStream *is,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  InputStreamMutex *pIVar3;
  undefined4 extraout_var;
  size_t i;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_03012e88;
  pDVar2 = (Data *)operator_new(0x180);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pDVar2->_deleteStream = false;
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,is,&pDVar2->version);
  pDVar2 = this->_data;
  if ((pDVar2->version & 0x1000) == 0) {
    pIVar3 = (InputStreamMutex *)operator_new(0x38);
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    pIVar3->is = (IStream *)0x0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    pIVar3->currentPosition = 0;
    (pIVar3->super_Mutex).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(pIVar3->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
    pDVar2->_streamData = pIVar3;
    pIVar3->is = is;
    Header::readFrom(&pDVar2->header,is,&pDVar2->version);
    initialize(this);
    pDVar2 = this->_data;
    TileOffsets::readFrom
              (&pDVar2->tileOffsets,pDVar2->_streamData->is,&pDVar2->fileIsComplete,false,false);
    iVar1 = (*this->_data->_streamData->is->_vptr_IStream[2])();
    pDVar2 = this->_data;
    pDVar2->memoryMapped = SUB41(iVar1,0);
    iVar1 = (*pDVar2->_streamData->is->_vptr_IStream[5])();
    this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar1);
  }
  else {
    compatibilityInitialize(this,is);
  }
  return;
}

Assistant:

TiledInputFile::TiledInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int numThreads):
    _data (new Data (numThreads))
{
    _data->_deleteStream=false;
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //

    bool streamDataCreated = false;

    try
    {
        try
        {
            readMagicNumberAndVersionField(is, _data->version);

            //
            // Backward compatibility to read multpart file.
            //
            if (isMultiPart(_data->version))
            {
                compatibilityInitialize(is);
                return;
            }

            streamDataCreated = true;
            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = &is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            // file is guaranteed to be single part, regular image
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,false);
            _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
        catch (IEX_NAMESPACE::BaseExc &e)
        {
            REPLACE_EXC (e, "Cannot open image file "
                    "\"" << is.fileName() << "\". " << e.what());
            throw;
        }
    }
    catch (...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if( _data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        if (streamDataCreated) delete _data->_streamData;
	delete _data;
        throw;
    }
}